

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

void deflate_make_huffman_code
               (uint num_syms,uint max_codeword_len,u32 *freqs,u8 *lens,u32 *codewords)

{
  uint *puVar1;
  byte bVar2;
  u8 uVar3;
  u8 uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint len_counts [16];
  int local_4f8 [16];
  uint local_4b8 [290];
  
  uVar19 = (ulong)num_syms;
  uVar18 = 0;
  memset(local_4b8,0,uVar19 * 4);
  if (num_syms != 0) {
    uVar8 = 0;
    do {
      uVar17 = freqs[uVar8];
      if (num_syms - 1 <= freqs[uVar8]) {
        uVar17 = num_syms - 1;
      }
      local_4b8[uVar17] = local_4b8[uVar17] + 1;
      uVar8 = uVar8 + 1;
    } while (uVar19 != uVar8);
  }
  if (1 < num_syms) {
    uVar8 = 1;
    uVar17 = 0;
    do {
      uVar18 = local_4b8[uVar8] + uVar17;
      local_4b8[uVar8] = uVar17;
      uVar8 = uVar8 + 1;
      uVar17 = uVar18;
    } while (uVar19 != uVar8);
  }
  if (num_syms != 0) {
    uVar8 = 0;
    do {
      uVar17 = freqs[uVar8];
      if (uVar17 == 0) {
        lens[uVar8] = '\0';
      }
      else {
        uVar10 = uVar17;
        if (num_syms - 1 <= uVar17) {
          uVar10 = num_syms - 1;
        }
        uVar13 = local_4b8[uVar10];
        local_4b8[uVar10] = uVar13 + 1;
        codewords[uVar13] = (uint)uVar8 | uVar17 << 10;
      }
      uVar8 = uVar8 + 1;
    } while (uVar19 != uVar8);
  }
  uVar17 = local_4b8[num_syms - 2];
  uVar10 = local_4b8[num_syms - 1] - uVar17;
  if (1 < uVar10) {
    uVar13 = uVar10 >> 1;
    do {
      uVar12 = codewords[(ulong)uVar17 + ((ulong)uVar13 - 1)];
      uVar6 = uVar13 * 2;
      uVar14 = uVar13;
      if (uVar6 <= uVar10) {
        uVar8 = (ulong)uVar13;
        do {
          if ((uVar10 <= uVar6) ||
             (uVar7 = (ulong)(uVar6 | 1),
             codewords[(ulong)uVar17 + ((ulong)(uVar6 | 1) - 1)] <=
             codewords[(ulong)uVar17 + ((ulong)uVar6 - 1)])) {
            uVar7 = (ulong)uVar6;
          }
          uVar14 = (uint)uVar7;
          if (codewords[(ulong)uVar17 + (uVar7 - 1)] <= uVar12) {
            uVar14 = (uint)uVar8;
            break;
          }
          codewords[(ulong)uVar17 + (uVar8 - 1)] = codewords[(ulong)uVar17 + (uVar7 - 1)];
          uVar6 = uVar14 * 2;
          uVar8 = uVar7;
        } while (uVar6 <= uVar10);
      }
      codewords[(ulong)uVar17 + ((ulong)uVar14 - 1)] = uVar12;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  if (1 < uVar10) {
    puVar1 = codewords + uVar17;
    uVar8 = (ulong)uVar10;
    do {
      uVar10 = puVar1[uVar8 - 1];
      puVar1[uVar8 - 1] = *puVar1;
      *puVar1 = uVar10;
      uVar13 = (uint)(uVar8 - 1);
      uVar7 = 1;
      if (uVar8 != 2) {
        uVar16 = 2;
        uVar7 = 1;
        do {
          if ((uVar13 <= (uint)uVar16) ||
             (uVar15 = (ulong)((uint)uVar16 | 1),
             codewords[(ulong)uVar17 + (uVar15 - 1)] <= codewords[(ulong)uVar17 + (uVar16 - 1)])) {
            uVar15 = uVar16;
          }
          if (codewords[(ulong)uVar17 + (uVar15 - 1)] <= uVar10) break;
          codewords[(ulong)uVar17 + (uVar7 - 1)] = codewords[(ulong)uVar17 + (uVar15 - 1)];
          uVar12 = (int)uVar15 * 2;
          uVar16 = (ulong)uVar12;
          uVar7 = uVar15;
        } while (uVar12 <= uVar13);
      }
      codewords[(ulong)uVar17 + (uVar7 - 1)] = uVar10;
      uVar8 = uVar8 - 1;
    } while (1 < uVar13);
  }
  if (uVar18 < 2) {
    deflate_make_huffman_code_cold_1();
  }
  else {
    iVar11 = 0;
    uVar8 = 0;
    uVar17 = 0;
    uVar10 = 0;
    do {
      uVar13 = uVar17 + 1;
      if (uVar18 - 1 < uVar13) {
LAB_00106af7:
        if ((uVar8 < uVar10 + 2) ||
           ((uVar17 <= uVar18 - 1 &&
            ((codewords[uVar17] & 0xfffffc00) <= (codewords[uVar10 + 1] & 0xfffffc00))))) {
          uVar12 = (codewords[uVar10] & 0xfffffc00) + (codewords[uVar17] & 0xfffffc00);
          codewords[uVar10] = (codewords[uVar10] & 0x3ff) + iVar11;
          uVar17 = uVar13;
          uVar10 = uVar10 + 1;
        }
        else {
          uVar12 = (codewords[uVar10 + 1] & 0xfffffc00) + (codewords[uVar10] & 0xfffffc00);
          codewords[uVar10] = (codewords[uVar10] & 0x3ff) + iVar11;
          codewords[uVar10 + 1] = (codewords[uVar10 + 1] & 0x3ff) + iVar11;
          uVar10 = uVar10 + 2;
        }
      }
      else {
        if ((uVar8 != uVar10) &&
           ((codewords[uVar10] & 0xfffffc00) < (codewords[uVar13] & 0xfffffc00))) goto LAB_00106af7;
        uVar12 = (codewords[uVar13] & 0xfffffc00) + (codewords[uVar17] & 0xfffffc00);
        uVar17 = uVar17 + 2;
      }
      codewords[uVar8] = codewords[uVar8] & 0x3ff | uVar12;
      uVar8 = uVar8 + 1;
      iVar11 = iVar11 + 0x400;
    } while ((uVar18 - 1) + (uint)(uVar18 == 1) != uVar8);
    uVar8 = (ulong)max_codeword_len;
    memset(local_4f8,0,uVar8 * 4 + 4);
    local_4f8[1] = 2;
    codewords[uVar18 - 2] = codewords[uVar18 - 2] & 0x3ff;
    if (-1 < (int)(uVar18 - 3)) {
      uVar7 = (ulong)(uVar18 - 3);
      do {
        uVar18 = (codewords[codewords[uVar7] >> 10] >> 10) + 1;
        uVar16 = (ulong)uVar18;
        codewords[uVar7] = uVar18 * 0x400 | codewords[uVar7] & 0x3ff;
        if (max_codeword_len <= uVar18) {
          uVar16 = (ulong)max_codeword_len;
          do {
            uVar16 = (ulong)((int)uVar16 - 1);
          } while (local_4f8[uVar16] == 0);
        }
        local_4f8[uVar16] = local_4f8[uVar16] + -1;
        local_4f8[(int)uVar16 + 1] = local_4f8[(int)uVar16 + 1] + 2;
        bVar5 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar5);
    }
    if (max_codeword_len != 0) {
      uVar7 = 0;
      do {
        for (iVar11 = local_4f8[uVar8]; iVar11 != 0; iVar11 = iVar11 + -1) {
          lens[codewords[uVar7] & 0x3ff] = (u8)uVar8;
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        uVar8 = uVar8 - 1;
      } while ((int)uVar8 != 0);
    }
    local_4b8[0] = 0;
    local_4b8[1] = 0;
    if (1 < max_codeword_len) {
      local_4b8[1] = 0;
      lVar9 = 0;
      do {
        local_4b8[1] = (local_4b8[1] + local_4f8[lVar9 + 1]) * 2;
        local_4b8[lVar9 + 2] = local_4b8[1];
        lVar9 = lVar9 + 1;
      } while ((ulong)(max_codeword_len + 1) - 2 != lVar9);
    }
    if (num_syms != 0) {
      uVar8 = 0;
      do {
        bVar2 = lens[uVar8];
        uVar18 = local_4b8[bVar2];
        uVar3 = ""[uVar18 & 0xff];
        uVar4 = ""[uVar18 >> 8];
        local_4b8[bVar2] = uVar18 + 1;
        codewords[uVar8] = (uint)(ushort)(CONCAT11(uVar3,uVar4) >> (0x10 - bVar2 & 0x1f));
        uVar8 = uVar8 + 1;
      } while (uVar19 != uVar8);
    }
  }
  return;
}

Assistant:

static void
deflate_make_huffman_code(unsigned num_syms, unsigned max_codeword_len,
			  const u32 freqs[], u8 lens[], u32 codewords[])
{
	u32 *A = codewords;
	unsigned num_used_syms;

	STATIC_ASSERT(DEFLATE_MAX_NUM_SYMS <= 1 << NUM_SYMBOL_BITS);
	STATIC_ASSERT(MAX_BLOCK_LENGTH <= ((u32)1 << NUM_FREQ_BITS) - 1);

	/*
	 * We begin by sorting the symbols primarily by frequency and
	 * secondarily by symbol value.  As an optimization, the array used for
	 * this purpose ('A') shares storage with the space in which we will
	 * eventually return the codewords.
	 */
	num_used_syms = sort_symbols(num_syms, freqs, lens, A);
	/*
	 * 'num_used_syms' is the number of symbols with nonzero frequency.
	 * This may be less than @num_syms.  'num_used_syms' is also the number
	 * of entries in 'A' that are valid.  Each entry consists of a distinct
	 * symbol and a nonzero frequency packed into a 32-bit integer.
	 */

	/*
	 * A complete Huffman code must contain at least 2 codewords.  Yet, it's
	 * possible that fewer than 2 symbols were used.  When this happens,
	 * it's usually for the offset code (0-1 symbols used).  But it's also
	 * theoretically possible for the litlen and pre codes (1 symbol used).
	 *
	 * The DEFLATE RFC explicitly allows the offset code to contain just 1
	 * codeword, or even be completely empty.  But it's silent about the
	 * other codes.  It also doesn't say whether, in the 1-codeword case,
	 * the codeword (which it says must be 1 bit) is '0' or '1'.
	 *
	 * In any case, some DEFLATE decompressors reject these cases.  zlib
	 * generally allows them, but it does reject precodes that have just 1
	 * codeword.  More problematically, zlib v1.2.1 and earlier rejected
	 * empty offset codes, and this behavior can also be seen in Windows
	 * Explorer's ZIP unpacker (supposedly even still in Windows 11).
	 *
	 * Other DEFLATE compressors, including zlib, always send at least 2
	 * codewords in order to make a complete Huffman code.  Therefore, this
	 * is a case where practice does not entirely match the specification.
	 * We follow practice by generating 2 codewords of length 1: codeword
	 * '0' for symbol 0, and codeword '1' for another symbol -- the used
	 * symbol if it exists and is not symbol 0, otherwise symbol 1.  This
	 * does worsen the compression ratio by having to send an unnecessary
	 * offset codeword length.  But this only affects rare cases such as
	 * blocks containing all literals, and it only makes a tiny difference.
	 */
	if (unlikely(num_used_syms < 2)) {
		unsigned sym = num_used_syms ? (A[0] & SYMBOL_MASK) : 0;
		unsigned nonzero_idx = sym ? sym : 1;

		codewords[0] = 0;
		lens[0] = 1;
		codewords[nonzero_idx] = 1;
		lens[nonzero_idx] = 1;
		return;
	}

	/*
	 * Build a stripped-down version of the Huffman tree, sharing the array
	 * 'A' with the symbol values.  Then extract length counts from the tree
	 * and use them to generate the final codewords.
	 */

	build_tree(A, num_used_syms);

	{
		unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];

		compute_length_counts(A, num_used_syms - 2,
				      len_counts, max_codeword_len);

		gen_codewords(A, lens, len_counts, max_codeword_len, num_syms);
	}
}